

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O2

shared_ptr<SearchBase> __thiscall findstr::makesearcher(findstr *this)

{
  pointer ppVar1;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<SearchBase> sVar2;
  vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_28;
  
  switch(*(undefined4 *)(in_RSI + 0x20)) {
  case 0:
    std::make_shared<regexsearcher,std::__cxx11::string&,bool&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28,
               (bool *)(in_RSI + 0x28));
    break;
  case 1:
    std::
    make_shared<stringsearch<std::default_searcher<char_const*,std::equal_to<void>>>,std::vector<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&>
              (&local_28);
    break;
  case 2:
    std::
    make_shared<stringsearch<std::boyer_moore_searcher<char_const*,std::hash<char>,std::equal_to<void>>>,std::vector<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&>
              (&local_28);
    break;
  case 3:
    std::
    make_shared<stringsearch<std::boyer_moore_horspool_searcher<char_const*,std::hash<char>,std::equal_to<void>>>,std::vector<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&>
              (&local_28);
    break;
  case 4:
    std::
    make_shared<stringsearch<boost::algorithm::boyer_moore<char_const*,boost::algorithm::detail::BM_traits<char_const*>>>,std::vector<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&>
              (&local_28);
    break;
  case 5:
    std::
    make_shared<stringsearch<boost::algorithm::boyer_moore_horspool<char_const*,boost::algorithm::detail::BM_traits<char_const*>>>,std::vector<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&>
              (&local_28);
    break;
  case 6:
    std::
    make_shared<stringsearch<boost::algorithm::knuth_morris_pratt<char_const*>>,std::vector<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&>
              (&local_28);
    break;
  case 7:
    std::
    make_shared<masksearch,std::vector<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&>
              (&local_28);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unknown searchtype");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppVar1 = local_28.
           super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)this =
       local_28.
       super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)&this->verbose = ppVar1;
  local_28.
  super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_28.
              super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  sVar2.super___shared_ptr<SearchBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<SearchBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<SearchBase>)sVar2.super___shared_ptr<SearchBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SearchBase> makesearcher()
    {
        switch(searchtype) {
        case REGEX_SEARCH:
            return std::make_shared<regexsearcher>(pattern, matchcase);
        case STD_SEARCH:
            return std::make_shared<stringsearch<std::default_searcher<const char*>>>(bytemasks);
        case STD_BOYER_MOORE:
            return std::make_shared<stringsearch<SEARCHERNS::boyer_moore_searcher<const char*>>>(bytemasks);
        case STD_BOYER_MOORE_HORSPOOL:
            return std::make_shared<stringsearch<SEARCHERNS::boyer_moore_horspool_searcher<const char*>>>(bytemasks);
#ifdef USE_BOOST_REGEX
        case BOOST_BOYER_MOORE:
            return std::make_shared<stringsearch<boost::algorithm::boyer_moore<const char*>>>(bytemasks);
        case BOOST_BOYER_MOORE_HORSPOOL:
            return std::make_shared<stringsearch<boost::algorithm::boyer_moore_horspool<const char*>>>(bytemasks);
        case BOOST_KNUTH_MORRIS_PRATT:
            return std::make_shared<stringsearch<boost::algorithm::knuth_morris_pratt<const char*>>>(bytemasks);
#endif
        case BYTEMASK_SEARCH:
            return std::make_shared<masksearch>(bytemasks);
        }
        throw std::runtime_error("unknown searchtype");
    }